

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall PStruct::ReadFields(PStruct *this,FArchive *ar,void *addr)

{
  bool bVar1;
  int iVar2;
  char *text;
  DObject *this_00;
  byte bVar3;
  char *pcVar4;
  char *format;
  FName local_44;
  PStruct *local_40;
  void *local_38;
  
  local_38 = addr;
  text = FArchive::ReadName(ar);
  if (text == (char *)0x0) {
    bVar3 = 1;
  }
  else {
    bVar3 = 0;
    local_40 = this;
    while (text != (char *)0x0) {
      local_44.Index = FName::NameManager::FindName(&FName::NameData,text,true);
      this_00 = &PSymbolTable::FindSymbol
                           (&(this->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                            &local_44,true)->super_DObject;
      if (this_00 == (DObject *)0x0) {
        pcVar4 = FName::NameData.NameArray[(local_40->super_PNamedType).TypeName.Index].Text;
        format = "Cannot find field %s in %s\n";
LAB_0044a482:
        DPrintf(1,format,text,pcVar4);
        PType::SkipValue(ar);
      }
      else {
        bVar1 = DObject::IsKindOf(this_00,PField::RegistrationInfo.MyClass);
        if (!bVar1) {
          pcVar4 = FName::NameData.NameArray[(local_40->super_PNamedType).TypeName.Index].Text;
          format = "Symbol %s in %s is not a field\n";
          goto LAB_0044a482;
        }
        iVar2 = (*((this_00[1].Class)->super_PStruct).super_PNamedType.super_PCompoundType.
                  super_PType.super_DObject._vptr_DObject[8])
                          (this_00[1].Class,ar,
                           (ulong)*(uint *)&this_00[1]._vptr_DObject + (long)local_38);
        bVar3 = bVar3 | (byte)iVar2;
      }
      text = FArchive::ReadName(ar);
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool PStruct::ReadFields(FArchive &ar, void *addr) const
{
	bool readsomething = false;
	const char *label = ar.ReadName();
	if (label == NULL)
	{ // If there is nothing to restore, we count it as success.
		return true;
	}
	for (; label != NULL; label = ar.ReadName())
	{
		const PSymbol *sym = Symbols.FindSymbol(FName(label, true), true);
		if (sym == NULL)
		{
			DPrintf(DMSG_ERROR, "Cannot find field %s in %s\n",
				label, TypeName.GetChars());
			SkipValue(ar);
		}
		else if (!sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			DPrintf(DMSG_ERROR, "Symbol %s in %s is not a field\n",
				label, TypeName.GetChars());
			SkipValue(ar);
		}
		else
		{
			readsomething |= static_cast<const PField *>(sym)->Type->ReadValue(ar,
				(BYTE *)addr + static_cast<const PField *>(sym)->Offset);
		}
	}
	return readsomething;
}